

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,int64_t size,complex<float> value)

{
  complex<float> *__s;
  ulong uVar1;
  ulong __n;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x12,
                  "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<float>]");
  }
  __n = size * size * 8;
  uVar1 = 0;
  __s = (complex<float> *)operator_new__(-(ulong)((ulong)(size * size) >> 0x3d != 0) | __n);
  memset(__s,0,__n);
  do {
    *(ulong *)((long)&__s->_M_value + uVar1) = CONCAT44(in_XMM0_Db,in_XMM0_Da);
    uVar1 = uVar1 + 8;
  } while (__n != uVar1);
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = __s;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<std::complex<float>>::SquareMatrix(const int64_t, const T) [T = std::complex<float>]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }